

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int compare2fPoint(void *a,void *b)

{
  float *bf;
  float *af;
  void *b_local;
  void *a_local;
  
  if (*b <= *a) {
    if (*a < *b || *a == *b) {
      if (*(float *)((long)b + 4) <= *(float *)((long)a + 4)) {
        if (*(float *)((long)a + 4) < *(float *)((long)b + 4) ||
            *(float *)((long)a + 4) == *(float *)((long)b + 4)) {
          a_local._4_4_ = 0;
        }
        else {
          a_local._4_4_ = 1;
        }
      }
      else {
        a_local._4_4_ = -1;
      }
    }
    else {
      a_local._4_4_ = 1;
    }
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

static int compare2fPoint(const void* a, const void* b)
{
  const float* af = (const float*)a;
  const float* bf = (const float*)b;
  if (af[0] < bf[0])
    return -1;
  if (af[0] > bf[0])
    return 1;
  if (af[1] < bf[1])
    return -1;
  if (af[1] > bf[1])
    return 1;
  return 0;
}